

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

bool __thiscall xscript::parser::ast::predict_type_declarator(ast *this)

{
  uint uVar1;
  
  uVar1 = (this->cur_token).type - TK_IDENTIFIER;
  return (bool)((byte)(0x7e0000000000001 >> ((byte)uVar1 & 0x3f)) & uVar1 < 0x3b);
}

Assistant:

bool ast::predict_type_declarator() {
    if (cur_token == tokenizer::TK_INT ||
        cur_token == tokenizer::TK_FLOAT ||
        cur_token == tokenizer::TK_BOOL ||
        cur_token == tokenizer::TK_STRING ||
        cur_token == tokenizer::TK_IDENTIFIER ||
        cur_token == tokenizer::TK_ARRAY ||
        cur_token == tokenizer::TK_MAP
    ) {
        return true;
    }
    return false;
}